

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

string * __thiscall
t_netstd_generator::func_name
          (string *__return_storage_ptr__,t_netstd_generator *this,string *fname,
          bool suppress_mapping)

{
  string local_48;
  undefined1 local_21;
  string *psStack_20;
  bool suppress_mapping_local;
  string *fname_local;
  t_netstd_generator *this_local;
  
  local_21 = suppress_mapping;
  psStack_20 = fname;
  fname_local = (string *)this;
  this_local = (t_netstd_generator *)__return_storage_ptr__;
  if (suppress_mapping) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fname);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)fname);
    get_mapped_member_name(__return_storage_ptr__,this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::func_name(std::string fname, bool suppress_mapping) {
  if (suppress_mapping) {
    return fname;
  }

  return get_mapped_member_name(fname);
}